

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O0

TConstUnion __thiscall glslang::TConstUnion::operator%(TConstUnion *this,TConstUnion *constant)

{
  TConstUnion TVar1;
  TConstUnion *constant_local;
  TConstUnion *this_local;
  TConstUnion returnValue;
  
  TConstUnion((TConstUnion *)&this_local);
  if (this->type == constant->type) {
    switch(this->type) {
    case EbtInt8:
      setI8Const((TConstUnion *)&this_local,(this->field_0).i8Const % (constant->field_0).i8Const);
      break;
    case EbtUint8:
      setU8Const((TConstUnion *)&this_local,
                 (uchar)((ulong)(this->field_0).u8Const %
                        (ulong)(long)(int)(uint)(constant->field_0).u8Const));
      break;
    case EbtInt16:
      setI16Const((TConstUnion *)&this_local,(this->field_0).i16Const % (constant->field_0).i16Const
                 );
      break;
    case EbtUint16:
      setU16Const((TConstUnion *)&this_local,
                  (unsigned_short)
                  ((ulong)(this->field_0).u16Const %
                  (ulong)(long)(int)(uint)(constant->field_0).u16Const));
      break;
    case EbtInt:
      setIConst((TConstUnion *)&this_local,(this->field_0).iConst % (constant->field_0).iConst);
      break;
    case EbtUint:
      setUConst((TConstUnion *)&this_local,(this->field_0).uConst % (constant->field_0).uConst);
      break;
    case EbtInt64:
      setI64Const((TConstUnion *)&this_local,(this->field_0).i64Const % (constant->field_0).i64Const
                 );
      break;
    case EbtUint64:
      setU64Const((TConstUnion *)&this_local,(this->field_0).u64Const % (constant->field_0).u64Const
                 );
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x1ff,"TConstUnion glslang::TConstUnion::operator%(const TConstUnion &) const")
      ;
    }
    TVar1._12_4_ = 0;
    TVar1.field_0 = (anon_union_8_11_a9b10978_for_TConstUnion_0)this_local;
    TVar1.type = returnValue.field_0._0_4_;
    return TVar1;
  }
  __assert_fail("type == constant.type",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                ,0x1f5,"TConstUnion glslang::TConstUnion::operator%(const TConstUnion &) const");
}

Assistant:

TConstUnion operator%(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        assert(type == constant.type);
        switch (type) {
        case EbtInt:    returnValue.setIConst(iConst % constant.iConst); break;
        case EbtUint:   returnValue.setUConst(uConst % constant.uConst); break;
        case EbtInt8:   returnValue.setI8Const(i8Const % constant.i8Const); break;
        case EbtInt16:  returnValue.setI16Const(i16Const % constant.i16Const); break;
        case EbtInt64:  returnValue.setI64Const(i64Const % constant.i64Const); break;
        case EbtUint8:  returnValue.setU8Const(u8Const % constant.u8Const); break;
        case EbtUint16: returnValue.setU16Const(u16Const % constant.u16Const); break;
        case EbtUint64: returnValue.setU64Const(u64Const % constant.u64Const); break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }